

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int I420Mirror(uint8_t *src_y,int src_stride_y,uint8_t *src_u,int src_stride_u,uint8_t *src_v,
              int src_stride_v,uint8_t *dst_y,int dst_stride_y,uint8_t *dst_u,int dst_stride_u,
              uint8_t *dst_v,int dst_stride_v,int width,int height)

{
  int width_00;
  int height_00;
  int in_ECX;
  uint8_t *in_RDX;
  long in_RDI;
  uint8_t *in_R8;
  int in_R9D;
  long in_stack_00000008;
  int halfheight;
  int halfwidth;
  int in_stack_00000040;
  int local_4;
  
  width_00 = (int)src_y + 1 >> 1;
  height_00 = in_stack_00000040 + 1 >> 1;
  if ((((in_RDI == 0) || (in_RDX == (uint8_t *)0x0)) || (in_R8 == (uint8_t *)0x0)) ||
     (((src_v == (uint8_t *)0x0 || (src_u == (uint8_t *)0x0)) ||
      (((int)src_y < 1 || (in_stack_00000040 == 0)))))) {
    local_4 = -1;
  }
  else {
    if (in_stack_00000040 < 0) {
      in_stack_00000040 = -in_stack_00000040;
      height_00 = in_stack_00000040 + 1 >> 1;
      in_RDX = in_RDX + (height_00 + -1) * in_ECX;
      in_R8 = in_R8 + (height_00 + -1) * in_R9D;
      in_ECX = -in_ECX;
      in_R9D = -in_R9D;
    }
    if (in_stack_00000008 != 0) {
      MirrorPlane(in_RDX,in_ECX,in_R8,in_R9D,width_00,height_00);
    }
    MirrorPlane(in_RDX,in_ECX,in_R8,in_R9D,width_00,height_00);
    MirrorPlane(in_RDX,in_ECX,in_R8,in_R9D,width_00,height_00);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int I420Mirror(const uint8_t* src_y,
               int src_stride_y,
               const uint8_t* src_u,
               int src_stride_u,
               const uint8_t* src_v,
               int src_stride_v,
               uint8_t* dst_y,
               int dst_stride_y,
               uint8_t* dst_u,
               int dst_stride_u,
               uint8_t* dst_v,
               int dst_stride_v,
               int width,
               int height) {
  int halfwidth = (width + 1) >> 1;
  int halfheight = (height + 1) >> 1;
  if (!src_y || !src_u || !src_v || !dst_u || !dst_v || width <= 0 ||
      height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    halfheight = (height + 1) >> 1;
    src_y = src_y + (height - 1) * src_stride_y;
    src_u = src_u + (halfheight - 1) * src_stride_u;
    src_v = src_v + (halfheight - 1) * src_stride_v;
    src_stride_y = -src_stride_y;
    src_stride_u = -src_stride_u;
    src_stride_v = -src_stride_v;
  }

  if (dst_y) {
    MirrorPlane(src_y, src_stride_y, dst_y, dst_stride_y, width, height);
  }
  MirrorPlane(src_u, src_stride_u, dst_u, dst_stride_u, halfwidth, halfheight);
  MirrorPlane(src_v, src_stride_v, dst_v, dst_stride_v, halfwidth, halfheight);
  return 0;
}